

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

void __thiscall CPU::MOS6502::State::State(State *this)

{
  allocator<char> local_41;
  string local_40;
  
  (this->super_StructImpl<CPU::MOS6502::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__0058d9e0;
  Registers::Registers(&this->registers);
  Inputs::Inputs(&this->inputs);
  ExecutionState::ExecutionState(&this->execution_state);
  if (Reflection::StructImpl<CPU::MOS6502::State>::contents__abi_cxx11_._M_h._M_element_count == 0)
  {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"registers",&local_41);
    Reflection::StructImpl<CPU::MOS6502::State>::declare<CPU::MOS6502::State::Registers>
              (&this->super_StructImpl<CPU::MOS6502::State>,&this->registers,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"execution_state",&local_41);
    Reflection::StructImpl<CPU::MOS6502::State>::declare<CPU::MOS6502::State::ExecutionState>
              (&this->super_StructImpl<CPU::MOS6502::State>,&this->execution_state,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"inputs",&local_41);
    Reflection::StructImpl<CPU::MOS6502::State>::declare<CPU::MOS6502::State::Inputs>
              (&this->super_StructImpl<CPU::MOS6502::State>,&this->inputs,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

State::State() {
	if(needs_declare()) {
		DeclareField(registers);
		DeclareField(execution_state);
		DeclareField(inputs);
	}
}